

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O1

void init_once(void)

{
  int iVar1;
  char *__nptr;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  uv_sem_t sem;
  uv_sem_t uStack_48;
  
  iVar1 = pthread_atfork((__prepare *)0x0,(__parent *)0x0,reset_once);
  if (iVar1 == 0) {
    nthreads = 4;
    __nptr = getenv("UV_THREADPOOL_SIZE");
    if (__nptr != (char *)0x0) {
      nthreads = atoi(__nptr);
    }
    if (nthreads == 0) {
      nthreads = 1;
    }
    if (0x400 < nthreads) {
      nthreads = 0x400;
    }
    threads = default_threads;
    if (4 < (ulong)nthreads) {
      threads = (uv_thread_t *)uv__malloc((ulong)nthreads << 3);
      if (threads == (uv_thread_t *)0x0) {
        nthreads = 4;
        threads = default_threads;
      }
    }
    iVar1 = uv_cond_init(&cond);
    if (iVar1 == 0) {
      iVar1 = uv_mutex_init(&mutex);
      if (iVar1 == 0) {
        wq[0] = wq;
        wq[1] = wq;
        slow_io_pending_wq[0] = slow_io_pending_wq;
        slow_io_pending_wq[1] = slow_io_pending_wq;
        run_slow_work_message[0] = run_slow_work_message;
        run_slow_work_message[1] = run_slow_work_message;
        iVar1 = uv_sem_init(&uStack_48,0);
        if (iVar1 == 0) {
          if (nthreads != 0) {
            lVar4 = 0;
            uVar3 = 0;
            do {
              iVar1 = uv_thread_create((uv_thread_t *)((long)threads + lVar4),worker,&uStack_48);
              if (iVar1 != 0) goto LAB_00122360;
              uVar3 = uVar3 + 1;
              lVar4 = lVar4 + 8;
            } while (uVar3 < nthreads);
          }
          if (nthreads != 0) {
            uVar2 = 0;
            do {
              uv_sem_wait(&uStack_48);
              uVar2 = uVar2 + 1;
            } while (uVar2 < nthreads);
          }
          uv_sem_destroy(&uStack_48);
          return;
        }
      }
    }
  }
LAB_00122360:
  abort();
}

Assistant:

static void init_once(void) {
#ifndef _WIN32
  /* Re-initialize the threadpool after fork.
   * Note that this discards the global mutex and condition as well
   * as the work queue.
   */
  if (pthread_atfork(NULL, NULL, &reset_once))
    abort();
#endif
  init_threads();
}